

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O1

float64 propagateFloat64NaN(float64 a,float64 b,float_status *status)

{
  bool bVar1;
  bool bVar2;
  float64 fVar3;
  byte bVar4;
  byte bVar5;
  
  bVar4 = 2;
  bVar5 = 2;
  if (0x7ff0000000000000 < (a & 0x7fffffffffffffff)) {
    bVar5 = ((a & 0x7ffffffffffff) == 0 || (a & 0x7ff8000000000000) != 0x7ff0000000000000) ^ 5;
  }
  if (0x7ff0000000000000 < (b & 0x7fffffffffffffff)) {
    bVar4 = ((b & 0x7ffffffffffff) == 0 || (b & 0x7ff8000000000000) != 0x7ff0000000000000) ^ 5;
  }
  if ((bVar5 == 5) || (bVar4 == 5)) {
    status->float_exception_flags = status->float_exception_flags | 1;
  }
  if (status->default_nan_mode != '\0') {
    return 0x7ff8000000000000;
  }
  bVar2 = a * 2 < b * 2 || b <= a && a * 2 <= b * 2;
  if (bVar5 == 4) {
    if (bVar4 != 5) {
      bVar1 = bVar4 == 4 && bVar2;
      goto LAB_00d01471;
    }
LAB_00d01485:
    fVar3 = a | 0x8000000000000;
    if (bVar5 != 5) {
      fVar3 = a;
    }
  }
  else {
    if (bVar5 == 5) {
      bVar1 = bVar4 == 4;
      if (bVar4 == 5) {
        bVar1 = bVar2;
      }
LAB_00d01471:
      if (!bVar1) goto LAB_00d01485;
    }
    fVar3 = b | 0x8000000000000;
    if (bVar4 != 5) {
      fVar3 = b;
    }
  }
  return fVar3;
}

Assistant:

static float64 propagateFloat64NaN(float64 a, float64 b, float_status *status)
{
    flag aIsLargerSignificand;
    uint64_t av, bv;
    FloatClass a_cls, b_cls;

    /* This is not complete, but is good enough for pickNaN.  */
    a_cls = (!float64_is_any_nan(a)
             ? float_class_normal
             : float64_is_signaling_nan(a, status)
             ? float_class_snan
             : float_class_qnan);
    b_cls = (!float64_is_any_nan(b)
             ? float_class_normal
             : float64_is_signaling_nan(b, status)
             ? float_class_snan
             : float_class_qnan);

    av = float64_val(a);
    bv = float64_val(b);

    if (is_snan(a_cls) || is_snan(b_cls)) {
        float_raise(float_flag_invalid, status);
    }

    if (status->default_nan_mode) {
        return float64_default_nan(status);
    }

    if ((uint64_t)(av << 1) < (uint64_t)(bv << 1)) {
        aIsLargerSignificand = 0;
    } else if ((uint64_t)(bv << 1) < (uint64_t)(av << 1)) {
        aIsLargerSignificand = 1;
    } else {
        aIsLargerSignificand = (av < bv) ? 1 : 0;
    }

    if (pickNaN(a_cls, b_cls, aIsLargerSignificand)) {
        if (is_snan(b_cls)) {
            return float64_silence_nan(b, status);
        }
        return b;
    } else {
        if (is_snan(a_cls)) {
            return float64_silence_nan(a, status);
        }
        return a;
    }
}